

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaVarIterator.cpp
# Opt level: O1

void __thiscall Kernel::FormulaVarIterator::FormulaVarIterator(FormulaVarIterator *this,Term *t)

{
  Term ***pppTVar1;
  size_t sVar2;
  Instruction *pIVar3;
  int *res;
  int *piVar4;
  
  this->_found = false;
  (this->_bound)._counts.super_Array<int>._vptr_Array = (_func_int **)&PTR_fillInterval_00b63a60;
  (this->_bound)._counts.super_Array<int>._capacity = 0x1f;
  piVar4 = (int *)::operator_new(0x80,0x10);
  piVar4[0] = 0;
  piVar4[1] = 0;
  piVar4[2] = 0;
  piVar4[3] = 0;
  piVar4[4] = 0;
  piVar4[5] = 0;
  piVar4[6] = 0;
  piVar4[7] = 0;
  piVar4[8] = 0;
  piVar4[9] = 0;
  piVar4[10] = 0;
  piVar4[0xb] = 0;
  piVar4[0xc] = 0;
  piVar4[0xd] = 0;
  piVar4[0xe] = 0;
  piVar4[0xf] = 0;
  piVar4[0x10] = 0;
  piVar4[0x11] = 0;
  piVar4[0x12] = 0;
  piVar4[0x13] = 0;
  piVar4[0x14] = 0;
  piVar4[0x15] = 0;
  piVar4[0x16] = 0;
  piVar4[0x17] = 0;
  piVar4[0x18] = 0;
  piVar4[0x19] = 0;
  piVar4[0x1a] = 0;
  piVar4[0x1b] = 0;
  piVar4[0x1b] = 0;
  piVar4[0x1c] = 0;
  piVar4[0x1d] = 0;
  piVar4[0x1e] = 0;
  (this->_bound)._counts.super_Array<int>._array = piVar4;
  (this->_bound)._counts.super_Array<int>._vptr_Array = (_func_int **)&PTR_fillInterval_00b67948;
  sVar2 = (this->_bound)._counts.super_Array<int>._capacity;
  if (sVar2 != 0) {
    memset(piVar4,0,sVar2 << 2);
  }
  (this->_free)._counts.super_Array<int>._vptr_Array = (_func_int **)&PTR_fillInterval_00b63a60;
  (this->_free)._counts.super_Array<int>._capacity = 0x1f;
  piVar4 = (int *)::operator_new(0x80,0x10);
  piVar4[0x1b] = 0;
  piVar4[0x1c] = 0;
  piVar4[0x1d] = 0;
  piVar4[0x1e] = 0;
  piVar4[0x18] = 0;
  piVar4[0x19] = 0;
  piVar4[0x1a] = 0;
  piVar4[0x1b] = 0;
  piVar4[0x14] = 0;
  piVar4[0x15] = 0;
  piVar4[0x16] = 0;
  piVar4[0x17] = 0;
  piVar4[0x10] = 0;
  piVar4[0x11] = 0;
  piVar4[0x12] = 0;
  piVar4[0x13] = 0;
  piVar4[0xc] = 0;
  piVar4[0xd] = 0;
  piVar4[0xe] = 0;
  piVar4[0xf] = 0;
  piVar4[8] = 0;
  piVar4[9] = 0;
  piVar4[10] = 0;
  piVar4[0xb] = 0;
  piVar4[4] = 0;
  piVar4[5] = 0;
  piVar4[6] = 0;
  piVar4[7] = 0;
  piVar4[0] = 0;
  piVar4[1] = 0;
  piVar4[2] = 0;
  piVar4[3] = 0;
  (this->_free)._counts.super_Array<int>._array = piVar4;
  (this->_free)._counts.super_Array<int>._vptr_Array = (_func_int **)&PTR_fillInterval_00b67948;
  sVar2 = (this->_free)._counts.super_Array<int>._capacity;
  if (sVar2 != 0) {
    memset(piVar4,0,sVar2 << 2);
  }
  memset(&this->_formulas,0,0xa0);
  ::Lib::Stack<Kernel::FormulaVarIterator::Instruction>::expand(&this->_instructions);
  pIVar3 = (this->_instructions)._cursor;
  *pIVar3 = FVI_TERM;
  (this->_instructions)._cursor = pIVar3 + 1;
  if ((this->_terms)._cursor == (this->_terms)._end) {
    ::Lib::Stack<const_Kernel::Term_*>::expand(&this->_terms);
  }
  *(this->_terms)._cursor = t;
  pppTVar1 = &(this->_terms)._cursor;
  *pppTVar1 = *pppTVar1 + 1;
  return;
}

Assistant:

FormulaVarIterator::FormulaVarIterator(const Term* t)
  : _found(false)
{
  _instructions.push(FVI_TERM);
  _terms.push(t);
}